

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::auto_manage_torrents
          (session_impl *this,
          vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *list,
          int *dht_limit,int *tracker_limit,int *lsd_limit,int *hard_limit,int type_limit)

{
  int iVar1;
  pointer pptVar2;
  bool bVar3;
  torrent **t;
  pointer pptVar4;
  torrent *ptVar5;
  int local_34;
  
  local_34 = type_limit;
  pptVar4 = (list->
            super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pptVar2 = (list->
            super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pptVar4 == pptVar2) {
      return;
    }
    if (*hard_limit < 1) {
LAB_00293879:
      ptVar5 = *pptVar4;
      if (((ptVar5->super_torrent_hot_members).field_0x4b & 8) == 0) {
        torrent::log_to_all_peers(ptVar5,"auto manager pausing torrent");
        ptVar5 = *pptVar4;
      }
      torrent::set_paused(ptVar5,true,(pause_flags_t)0x3);
      *(uint *)&(*pptVar4)->field_0x5dd = *(uint *)&(*pptVar4)->field_0x5dd & 0xfeffffff;
      (*pptVar4)->field_0x5c0 = (*pptVar4)->field_0x5c0 & 0xfe;
      (*pptVar4)->field_0x5c0 = (*pptVar4)->field_0x5c0 & 0xfd;
    }
    else {
      bVar3 = torrent::is_inactive(*pptVar4);
      if (bVar3) {
        ptVar5 = *pptVar4;
        iVar1 = *dht_limit;
        *dht_limit = iVar1 + -1;
        *(uint *)&ptVar5->field_0x5dd =
             *(uint *)&ptVar5->field_0x5dd & 0xfeffffff | (uint)(0 < iVar1) << 0x18;
        ptVar5 = *pptVar4;
        iVar1 = *tracker_limit;
        *tracker_limit = iVar1 + -1;
        ptVar5->field_0x5c0 = ptVar5->field_0x5c0 & 0xfe | 0 < iVar1;
        ptVar5 = *pptVar4;
        iVar1 = *lsd_limit;
        *lsd_limit = iVar1 + -1;
        ptVar5->field_0x5c0 = ptVar5->field_0x5c0 & 0xfd | (0 < iVar1) * '\x02';
        *hard_limit = *hard_limit + -1;
        ptVar5 = *pptVar4;
        if (((ptVar5->super_torrent_hot_members).field_0x4b & 8) != 0) {
          torrent::log_to_all_peers(ptVar5,"auto manager starting (inactive) torrent");
          ptVar5 = *pptVar4;
        }
      }
      else {
        if ((local_34 < 1) || (*hard_limit < 1)) goto LAB_00293879;
        ptVar5 = *pptVar4;
        iVar1 = *dht_limit;
        *dht_limit = iVar1 + -1;
        *(uint *)&ptVar5->field_0x5dd =
             *(uint *)&ptVar5->field_0x5dd & 0xfeffffff | (uint)(0 < iVar1) << 0x18;
        ptVar5 = *pptVar4;
        iVar1 = *tracker_limit;
        *tracker_limit = iVar1 + -1;
        ptVar5->field_0x5c0 = ptVar5->field_0x5c0 & 0xfe | 0 < iVar1;
        ptVar5 = *pptVar4;
        iVar1 = *lsd_limit;
        *lsd_limit = iVar1 + -1;
        ptVar5->field_0x5c0 = ptVar5->field_0x5c0 & 0xfd | (0 < iVar1) * '\x02';
        *hard_limit = *hard_limit + -1;
        ptVar5 = *pptVar4;
        if (((ptVar5->super_torrent_hot_members).field_0x4b & 8) != 0) {
          torrent::log_to_all_peers(ptVar5,"auto manager starting torrent");
          ptVar5 = *pptVar4;
        }
        local_34 = local_34 + -1;
      }
      torrent::set_paused(ptVar5,false,(pause_flags_t)0x0);
    }
    pptVar4 = pptVar4 + 1;
  } while( true );
}

Assistant:

void session_impl::auto_manage_torrents(std::vector<torrent*>& list
		, int& dht_limit, int& tracker_limit
		, int& lsd_limit, int& hard_limit, int type_limit)
	{
		for (auto& t : list)
		{
			TORRENT_ASSERT(t->state() != torrent_status::checking_files);

			// inactive torrents don't count (and if you configured them to do so,
			// the torrent won't say it's inactive)
			if (hard_limit > 0 && t->is_inactive())
			{
				t->set_announce_to_dht(--dht_limit >= 0);
				t->set_announce_to_trackers(--tracker_limit >= 0);
				t->set_announce_to_lsd(--lsd_limit >= 0);

				--hard_limit;
#ifndef TORRENT_DISABLE_LOGGING
				if (t->is_torrent_paused())
					t->log_to_all_peers("auto manager starting (inactive) torrent");
#endif
				t->set_paused(false);
				continue;
			}

			if (type_limit > 0 && hard_limit > 0)
			{
				t->set_announce_to_dht(--dht_limit >= 0);
				t->set_announce_to_trackers(--tracker_limit >= 0);
				t->set_announce_to_lsd(--lsd_limit >= 0);

				--hard_limit;
				--type_limit;
#ifndef TORRENT_DISABLE_LOGGING
				if (t->is_torrent_paused())
					t->log_to_all_peers("auto manager starting torrent");
#endif
				t->set_paused(false);
				continue;
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (!t->is_torrent_paused())
				t->log_to_all_peers("auto manager pausing torrent");
#endif
			// use graceful pause for auto-managed torrents
			t->set_paused(true, torrent_handle::graceful_pause
				| torrent_handle::clear_disk_cache);
			t->set_announce_to_dht(false);
			t->set_announce_to_trackers(false);
			t->set_announce_to_lsd(false);
		}
	}